

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariantanimation.cpp
# Opt level: O1

Interpolator QVariantAnimationPrivate::getInterpolator(int interpolationType)

{
  bool bVar1;
  QBasicMutex copy;
  code *pcVar2;
  undefined4 in_register_0000003c;
  
  pcVar2 = (code *)QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_registeredInterpolators>_>
                   ::operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_registeredInterpolators>_>
                                 *)CONCAT44(in_register_0000003c,interpolationType));
  if ((AtomicType)registeredInterpolatorsMutex.d_ptr._q_value._M_b._M_p == (AtomicType)0x0) {
    LOCK();
    registeredInterpolatorsMutex.d_ptr._q_value._M_b._M_p =
         (QBasicAtomicPointer<QMutexPrivate>)(AtomicType)0x1;
    UNLOCK();
  }
  else {
    QBasicMutex::lockInternal(&registeredInterpolatorsMutex);
  }
  copy.d_ptr._q_value._M_b._M_p = registeredInterpolatorsMutex.d_ptr._q_value._M_b._M_p;
  if (((long)interpolationType < (((Type *)pcVar2)->d).size) &&
     (pcVar2 = (((Type *)pcVar2)->d).ptr[interpolationType], (Type *)pcVar2 != (Type *)0x0)) {
    bVar1 = false;
  }
  else {
    bVar1 = true;
  }
  LOCK();
  registeredInterpolatorsMutex.d_ptr._q_value._M_b._M_p =
       (QBasicAtomicPointer<QMutexPrivate>)(AtomicType)0x0;
  UNLOCK();
  if ((AtomicType)copy.d_ptr._q_value._M_b._M_p != (AtomicType)0x1) {
    QBasicMutex::unlockInternalFutex
              (&registeredInterpolatorsMutex,(void *)copy.d_ptr._q_value._M_b._M_p);
  }
  if (bVar1) {
    pcVar2 = (code *)0x0;
    switch(interpolationType) {
    case 2:
      pcVar2 = _q_interpolateVariant<int>;
      break;
    case 3:
      pcVar2 = _q_interpolateVariant<unsigned_int>;
      break;
    case 4:
    case 5:
    case 7:
    case 8:
    case 9:
    case 10:
    case 0xb:
    case 0xc:
    case 0xd:
    case 0xe:
    case 0xf:
    case 0x10:
    case 0x11:
    case 0x12:
      break;
    case 6:
      pcVar2 = _q_interpolateVariant<double>;
      break;
    case 0x13:
      pcVar2 = _q_interpolateVariant<QRect>;
      break;
    case 0x14:
      pcVar2 = _q_interpolateVariant<QRectF>;
      break;
    case 0x15:
      pcVar2 = _q_interpolateVariant<QSize>;
      break;
    case 0x16:
      pcVar2 = _q_interpolateVariant<QSizeF>;
      break;
    case 0x17:
      pcVar2 = _q_interpolateVariant<QLine>;
      break;
    case 0x18:
      pcVar2 = _q_interpolateVariant<QLineF>;
      break;
    case 0x19:
      pcVar2 = _q_interpolateVariant<QPoint>;
      break;
    case 0x1a:
      pcVar2 = _q_interpolateVariant<QPointF>;
      break;
    default:
      if (interpolationType == 0x26) {
        pcVar2 = _q_interpolateVariant<float>;
      }
    }
  }
  return (Interpolator)(Type *)pcVar2;
}

Assistant:

QVariantAnimation::Interpolator QVariantAnimationPrivate::getInterpolator(int interpolationType)
{
    {
        QInterpolatorVector *interpolators = registeredInterpolators();
        const auto locker = qt_scoped_lock(registeredInterpolatorsMutex);
        QVariantAnimation::Interpolator ret = nullptr;
        if (interpolationType < interpolators->size()) {
            ret = interpolators->at(interpolationType);
            if (ret) return ret;
        }
    }

    switch(interpolationType)
    {
    case QMetaType::Int:
        return castToInterpolator(_q_interpolateVariant<int>);
    case QMetaType::UInt:
        return castToInterpolator(_q_interpolateVariant<uint>);
    case QMetaType::Double:
        return castToInterpolator(_q_interpolateVariant<double>);
    case QMetaType::Float:
        return castToInterpolator(_q_interpolateVariant<float>);
    case QMetaType::QLine:
        return castToInterpolator(_q_interpolateVariant<QLine>);
    case QMetaType::QLineF:
        return castToInterpolator(_q_interpolateVariant<QLineF>);
    case QMetaType::QPoint:
        return castToInterpolator(_q_interpolateVariant<QPoint>);
    case QMetaType::QPointF:
        return castToInterpolator(_q_interpolateVariant<QPointF>);
    case QMetaType::QSize:
        return castToInterpolator(_q_interpolateVariant<QSize>);
    case QMetaType::QSizeF:
        return castToInterpolator(_q_interpolateVariant<QSizeF>);
    case QMetaType::QRect:
        return castToInterpolator(_q_interpolateVariant<QRect>);
    case QMetaType::QRectF:
        return castToInterpolator(_q_interpolateVariant<QRectF>);
    default:
        return nullptr; //this type is not handled
    }
}